

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

int64_t tar_atol(char *p,size_t char_cnt)

{
  size_t char_cnt_local;
  char *p_local;
  
  if (((int)*p & 0x80U) == 0) {
    p_local = (char *)tar_atol8(p,char_cnt);
  }
  else {
    p_local = (char *)tar_atol256(p,char_cnt);
  }
  return (int64_t)p_local;
}

Assistant:

static int64_t
tar_atol(const char *p, size_t char_cnt)
{
	/*
	 * Technically, GNU tar considers a field to be in base-256
	 * only if the first byte is 0xff or 0x80.
	 */
	if (*p & 0x80)
		return (tar_atol256(p, char_cnt));
	return (tar_atol8(p, char_cnt));
}